

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall
wabt::interp::HostFunc::HostFunc(HostFunc *this,Store *param_1,FuncType *type,Callback *callback)

{
  ExternKind EVar1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_60;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  EVar1 = (type->super_ExternType).kind;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_60,&type->params);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_48,&type->results);
  (this->super_Func).super_Extern.super_Object.kind_ = HostFunc;
  *(undefined8 *)
   &(this->super_Func).super_Extern.super_Object.finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->super_Func).super_Extern.super_Object.finalizer_.super__Function_base._M_functor +
   8) = 0;
  (this->super_Func).super_Extern.super_Object.finalizer_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->super_Func).super_Extern.super_Object.finalizer_._M_invoker = (_Invoker_type)0x0;
  (this->super_Func).super_Extern.super_Object.host_info_ = (void *)0x0;
  (this->super_Func).super_Extern.super_Object.self_.index = 0;
  (this->super_Func).super_Extern.super_Object._vptr_Object = (_func_int **)&PTR__Func_00184330;
  (this->super_Func).type_.super_ExternType.kind = EVar1;
  (this->super_Func).type_.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001840c0
  ;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            (&(this->super_Func).type_.params,&local_60);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            (&(this->super_Func).type_.results,&local_48);
  if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Func).super_Extern.super_Object._vptr_Object = (_func_int **)&PTR__HostFunc_00183f20;
  *(undefined8 *)&(this->callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback_).super__Function_base._M_functor + 8) = 0;
  (this->callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback_)._M_invoker = (_Invoker_type)0x0;
  p_Var2 = (callback->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->callback_,(_Any_data *)callback,__clone_functor);
    p_Var3 = callback->_M_invoker;
    (this->callback_).super__Function_base._M_manager = (callback->super__Function_base)._M_manager;
    (this->callback_)._M_invoker = p_Var3;
  }
  return;
}

Assistant:

HostFunc::HostFunc(Store&, FuncType type, Callback callback)
    : Func(skind, type), callback_(callback) {}